

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteHelpRule
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  cmLocalUnixMakefileGenerator3 *pcVar1;
  pointer ppcVar2;
  cmGeneratorTarget *this_00;
  pointer pbVar3;
  ostream *os;
  bool bVar4;
  TargetType TVar5;
  string *__v;
  pointer ppcVar6;
  pointer ppcVar7;
  string *o;
  pointer pbVar8;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar9;
  allocator<char> local_e9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_98;
  ostream *local_78;
  pointer local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  no_depends;
  string path;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  no_depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emittedTargets,
             "The following are some of the valid targets for this Makefile:",
             (allocator<char> *)&local_98);
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  std::__cxx11::string::~string((string *)&emittedTargets);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emittedTargets,"... all (the default if no target is provided)",
             (allocator<char> *)&local_98);
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  std::__cxx11::string::~string((string *)&emittedTargets);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emittedTargets,"... clean",(allocator<char> *)&local_98);
  cmLocalUnixMakefileGenerator3::AppendEcho
            (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
  std::__cxx11::string::~string((string *)&emittedTargets);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&emittedTargets,"CMAKE_SUPPRESS_REGENERATION",(allocator<char> *)&local_98);
  bVar4 = cmGlobalGenerator::GlobalSettingIsOn((cmGlobalGenerator *)this,(string *)&emittedTargets);
  std::__cxx11::string::~string((string *)&emittedTargets);
  if (!bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emittedTargets,"... depend",(allocator<char> *)&local_98);
    cmLocalUnixMakefileGenerator3::AppendEcho
              (lg,&commands,(string *)&emittedTargets,EchoNormal,(EchoProgress *)0x0);
    std::__cxx11::string::~string((string *)&emittedTargets);
  }
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppcVar7 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_70 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emittedTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = ruleFileStream;
  do {
    os = local_78;
    if (ppcVar7 == local_70) {
      pbVar3 = (lg->LocalHelp).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (lg->LocalHelp).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3; pbVar8 = pbVar8 + 1
          ) {
        std::__cxx11::string::assign((char *)&path);
        std::__cxx11::string::append((string *)&path);
        cmLocalUnixMakefileGenerator3::AppendEcho(lg,&commands,&path,EchoNormal,(EchoProgress *)0x0)
        ;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"help",&local_e9);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (lg,os,"Help Target",&local_98,&no_depends,&commands,true,false);
      std::__cxx11::string::~string((string *)&local_98);
      std::operator<<(os,"\n\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&emittedTargets._M_t);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&commands);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&no_depends);
      std::__cxx11::string::~string((string *)&path);
      return;
    }
    pcVar1 = (cmLocalUnixMakefileGenerator3 *)*ppcVar7;
    if (pcVar1 == lg) {
LAB_0025cb1d:
      ppcVar2 = (pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar6 = (pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar2;
          ppcVar6 = ppcVar6 + 1) {
        this_00 = *ppcVar6;
        TVar5 = cmGeneratorTarget::GetType(this_00);
        if (TVar5 < INTERFACE_LIBRARY) {
          __v = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
          pVar9 = std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&emittedTargets,__v);
          if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            std::__cxx11::string::assign((char *)&path);
            std::__cxx11::string::append((string *)&path);
            cmLocalUnixMakefileGenerator3::AppendEcho
                      (lg,&commands,&path,EchoNormal,(EchoProgress *)0x0);
          }
        }
      }
    }
    else {
      bVar4 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
      if (bVar4) goto LAB_0025cb1d;
    }
    ppcVar7 = ppcVar7 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteHelpRule(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // add the help target
  std::string path;
  std::vector<std::string> no_depends;
  std::vector<std::string> commands;
  lg->AppendEcho(commands,
                 "The following are some of the valid targets "
                 "for this Makefile:");
  lg->AppendEcho(commands, "... all (the default if no target is provided)");
  lg->AppendEcho(commands, "... clean");
  if (!this->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION")) {
    lg->AppendEcho(commands, "... depend");
  }

  // Keep track of targets already listed.
  std::set<std::string> emittedTargets;

  // for each local generator
  for (cmLocalGenerator* localGen : this->LocalGenerators) {
    cmLocalUnixMakefileGenerator3* lg2 =
      static_cast<cmLocalUnixMakefileGenerator3*>(localGen);
    // for the passed in makefile or if this is the top Makefile wripte out
    // the targets
    if (lg2 == lg || lg->IsRootMakefile()) {
      // for each target Generate the rule files for each target.
      for (cmGeneratorTarget* target : lg2->GetGeneratorTargets()) {
        cmStateEnums::TargetType type = target->GetType();
        if ((type == cmStateEnums::EXECUTABLE) ||
            (type == cmStateEnums::STATIC_LIBRARY) ||
            (type == cmStateEnums::SHARED_LIBRARY) ||
            (type == cmStateEnums::MODULE_LIBRARY) ||
            (type == cmStateEnums::OBJECT_LIBRARY) ||
            (type == cmStateEnums::GLOBAL_TARGET) ||
            (type == cmStateEnums::UTILITY)) {
          std::string const& name = target->GetName();
          if (emittedTargets.insert(name).second) {
            path = "... ";
            path += name;
            lg->AppendEcho(commands, path);
          }
        }
      }
    }
  }
  for (std::string const& o : lg->GetLocalHelp()) {
    path = "... ";
    path += o;
    lg->AppendEcho(commands, path);
  }
  lg->WriteMakeRule(ruleFileStream, "Help Target", "help", no_depends,
                    commands, true);
  ruleFileStream << "\n\n";
}